

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O2

void __thiscall
QAbstractItemViewPrivate::maybeStartDrag(QAbstractItemViewPrivate *this,QPoint eventPosition)

{
  QAbstractItemView *this_00;
  int iVar1;
  undefined4 uVar2;
  QPoint QVar3;
  int iVar4;
  int iVar5;
  long in_FS_OFFSET;
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemView **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  QVar3 = offset(this);
  iVar4 = (this->pressedPosition).xp.m_i - (QVar3.xp.m_i.m_i + eventPosition.xp.m_i.m_i);
  iVar5 = (this->pressedPosition).yp.m_i - (QVar3.yp.m_i.m_i + eventPosition.yp.m_i.m_i);
  iVar1 = -iVar4;
  if (0 < iVar4) {
    iVar1 = iVar4;
  }
  iVar4 = -iVar5;
  if (0 < iVar5) {
    iVar4 = iVar5;
  }
  iVar5 = QApplication::startDragDistance();
  if (iVar5 < iVar4 + iVar1) {
    local_48.r = -1;
    local_48.c = -1;
    local_48.i = 0;
    local_48.m.ptr = (QAbstractItemModel *)0x0;
    QPersistentModelIndex::operator=(&this->pressedIndex,&local_48);
    uVar2 = (**(code **)(*(long *)this->model + 0xf0))();
    (**(code **)(*(long *)this_00 + 0x2f0))(this_00,uVar2);
    *(undefined4 *)(*(long *)(this_00 + 8) + 0x3a8) = 0;
    QAbstractItemView::stopAutoScroll(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::maybeStartDrag(QPoint eventPosition)
{
    Q_Q(QAbstractItemView);

    const QPoint topLeft = pressedPosition - offset();
    if ((topLeft - eventPosition).manhattanLength() > QApplication::startDragDistance()) {
        pressedIndex = QModelIndex();
        q->startDrag(model->supportedDragActions());
        q->setState(QAbstractItemView::NoState); // the startDrag will return when the dnd operation
                                                 // is done
        q->stopAutoScroll();
    }
}